

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void av1_filter_block_plane_horz_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  BLOCK_SIZE BVar1;
  uint8_t *puVar2;
  MB_MODE_INFO **ppMVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  loop_filter_info_n *lfi_n;
  bool bVar11;
  uint uVar12;
  uint8_t *dst;
  AV1_DEBLOCKING_PARAMETERS *pAVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  TX_SIZE *pTVar20;
  USE_FILTER_TYPE use_filter_type;
  ulong uVar21;
  byte *pbVar22;
  int iVar23;
  ulong uVar19;
  
  iVar14 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar17 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar14 < iVar17) {
    iVar17 = iVar14;
  }
  iVar8 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar14 = 0x20;
  if (iVar8 < 0x20) {
    iVar14 = iVar8;
  }
  if (0 < iVar8) {
    puVar2 = (plane_ptr->dst).buf;
    iVar8 = (plane_ptr->dst).stride;
    lVar15 = (long)(cm->mi_params).mi_stride;
    lfi_n = &cm->lf_info;
    uVar12 = 0;
    do {
      uVar18 = uVar12 + mi_col;
      uVar19 = (ulong)uVar18;
      params_buf->filter_length = '\0';
      uVar9 = (cm->mi_params).mi_stride * mi_row;
      ppMVar3 = (cm->mi_params).mi_grid_base;
      pMVar4 = ppMVar3[uVar9 + uVar19];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
        uVar16 = (ulong)pMVar4->tx_size;
        if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
           (pMVar4->skip_txfm == '\0')) {
          BVar1 = pMVar4->bsize;
          uVar16 = (ulong)pMVar4->inter_tx_size
                          [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [BVar1] - 1 & uVar18) >>
                           (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                           (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                   [BVar1] - 1 & mi_row) >>
                            (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                           (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
      }
      else {
        uVar16 = 0;
      }
      if (mi_row == 0) {
        bVar7 = 0x80;
      }
      else {
        pMVar5 = ppMVar3[(ulong)uVar9 + (uVar19 - lVar15)];
        if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) {
          uVar9 = (uint)pMVar5->tx_size;
          if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
             (pMVar5->skip_txfm == '\0')) {
            BVar1 = pMVar5->bsize;
            uVar9 = (uint)pMVar5->inter_tx_size
                          [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [BVar1] - 1 & uVar18) >>
                           (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                           (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                   [BVar1] - 1 & mi_row - 1) >>
                            (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                           (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
          }
        }
        else {
          uVar9 = 0;
        }
        bVar7 = block_size_wide[pMVar5->bsize];
        bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar4);
        if (bVar6 == 0) {
          bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar5);
        }
        bVar11 = true;
        if ((pMVar5 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
          if ((pMVar4->field_0xa7 & 0x80) == 0) {
            bVar11 = pMVar4->ref_frame[0] < '\x01';
          }
          else {
            bVar11 = false;
          }
        }
        if (pMVar5 == pMVar4) {
          if ((bool)(bVar11 & bVar6 != 0)) goto LAB_0038788d;
        }
        else if (bVar6 != 0) {
LAB_0038788d:
          params_buf->filter_length = (uint8_t)horz_filter_length_luma[uVar16][uVar9];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
        }
      }
      bVar6 = block_size_wide[pMVar4->bsize];
      if (bVar7 < block_size_wide[pMVar4->bsize]) {
        bVar6 = bVar7;
      }
      *tx_buf = (TX_SIZE)uVar16;
      iVar23 = tx_size_high_unit[uVar16];
      uVar9 = mi_row + iVar23;
      if (uVar9 < iVar17 + mi_row) {
        pTVar20 = tx_buf + iVar23;
        pAVar13 = params_buf + iVar23;
        do {
          pAVar13->filter_length = '\0';
          uVar10 = (cm->mi_params).mi_stride * uVar9;
          ppMVar3 = (cm->mi_params).mi_grid_base;
          pMVar4 = ppMVar3[uVar10 + uVar19];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0))
          {
            uVar21 = (ulong)pMVar4->tx_size;
            if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
               (pMVar4->skip_txfm == '\0')) {
              BVar1 = pMVar4->bsize;
              uVar21 = (ulong)pMVar4->inter_tx_size
                              [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                      [BVar1] - 1 & uVar18) >>
                               (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                               (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                       [BVar1] - 1 & uVar9) >>
                                (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                               (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
            }
          }
          else {
            uVar21 = 0;
          }
          pMVar5 = ppMVar3[(ulong)uVar10 + (uVar19 - lVar15)];
          bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar4);
          if (bVar7 == 0) {
            bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar5);
          }
          bVar11 = true;
          if ((pMVar5 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
            if ((pMVar4->field_0xa7 & 0x80) == 0) {
              bVar11 = pMVar4->ref_frame[0] < '\x01';
            }
            else {
              bVar11 = false;
            }
          }
          if (pMVar5 == pMVar4) {
            if ((bool)(bVar11 & bVar7 != 0)) goto LAB_00387a42;
          }
          else if (bVar7 != 0) {
LAB_00387a42:
            pAVar13->filter_length = (uint8_t)horz_filter_length_luma[uVar21][uVar16];
            pAVar13->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar7 * 0x30);
          }
          if (block_size_wide[pMVar4->bsize] <= bVar6) {
            bVar6 = block_size_wide[pMVar4->bsize];
          }
          *pTVar20 = (TX_SIZE)uVar21;
          iVar23 = tx_size_high_unit[uVar21];
          uVar9 = uVar9 + iVar23;
          pTVar20 = pTVar20 + iVar23;
          pAVar13 = pAVar13 + iVar23;
          uVar16 = uVar21;
        } while (uVar9 < iVar17 + mi_row);
      }
      if ((((uVar12 & 3) != 0) || (uVar9 = uVar12 | 3, iVar14 <= (int)uVar9)) ||
         (use_filter_type = '\x02', bVar6 < 0x10)) {
        uVar9 = uVar12 + 1;
        use_filter_type = 7 < bVar6 && (int)uVar9 < iVar14;
        if (7 >= bVar6 || (int)uVar9 >= iVar14) {
          uVar9 = uVar12;
        }
      }
      if (0 < iVar17) {
        dst = puVar2 + (int)(uVar12 << 2);
        iVar23 = 0;
        pbVar22 = tx_buf;
        pAVar13 = params_buf;
        do {
          if (*pbVar22 == 0xff) {
            pAVar13->filter_length = '\0';
            *pbVar22 = 0;
          }
          filter_horz(dst,iVar8,pAVar13,cm->seq_params,use_filter_type);
          uVar12 = tx_size_high_unit[*pbVar22];
          iVar23 = iVar23 + uVar12;
          dst = dst + iVar8 * 4 * uVar12;
          pbVar22 = pbVar22 + uVar12;
          pAVar13 = pAVar13 + uVar12;
        } while (iVar23 < iVar17);
      }
      uVar12 = uVar9 + 1;
    } while ((int)uVar12 < iVar14);
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);

  const ptrdiff_t mode_step = cm->mi_params.mi_stride;
  for (int x = 0; x < x_range; x++) {
    const uint32_t curr_x = mi_col + x;
    const uint32_t y_start = mi_row;
    const uint32_t y_end = mi_row + y_range;
    int min_block_width = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                     curr_x, y_start, plane_ptr, y_end,
                                     mode_step, &min_block_width);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + x * MI_SIZE;

    if ((x & 3) == 0 && (x + 3) < x_range && min_block_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      filter_type = USE_QUAD;
      x += 3;
    } else if ((x + 1) < x_range && min_block_width >= 8) {
      filter_type = USE_DUAL;
      x += 1;
    }

    for (int y = 0; y < y_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, params, cm->seq_params, filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}